

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  DataType baseType;
  DataType baseType_00;
  int iVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  long lVar4;
  TestNode *pTVar5;
  int iVar6;
  int vecSize;
  uint vecSize_00;
  int shaderTypeNdx;
  ShaderType SVar7;
  int prec;
  Precision PVar8;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"abs","abs");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (lVar4 != 2) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              AbsCase::AbsCase((AbsCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sign","sign")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (lVar4 != 2) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              SignCase::SignCase((SignCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                 iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"floor",
             "floor");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              FloorCase::FloorCase
                        ((FloorCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"trunc",
             "trunc");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              TruncCase::TruncCase
                        ((TruncCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"round",
             "round");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              RoundCase::RoundCase
                        ((RoundCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"roundeven",
             "roundeven");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              RoundEvenCase::RoundEvenCase
                        ((RoundEvenCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ceil","ceil")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              CeilCase::CeilCase((CeilCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                 iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fract",
             "fract");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              FractCase::FractCase
                        ((FractCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"modf","modf")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              ModfCase::ModfCase((ModfCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                 iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isnan",
             "isnan");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              IsnanCase::IsnanCase
                        ((IsnanCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isinf",
             "isinf");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              IsinfCase::IsinfCase
                        ((IsinfCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7);
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstoint","floatbitstoint");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              FloatBitsToUintIntCase::FloatBitsToUintIntCase
                        ((FloatBitsToUintIntCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7,true);
              pTVar3->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_021aaca0;
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstouint","floatbitstouint");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
              pTVar3 = (TestNode *)operator_new(0x280);
              FloatBitsToUintIntCase::FloatBitsToUintIntCase
                        ((FloatBitsToUintIntCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                         iVar1 + -1 + iVar6,PVar8,SVar7,false);
              pTVar3->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_021aad60;
              tcu::TestNode::addChild(pTVar2,pTVar3);
            }
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frexp",
             "frexp");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FrexpCase::FrexpCase
                      ((FrexpCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ldexp",
             "ldexp");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            LdexpCase::LdexpCase
                      ((LdexpCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fma","fma");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c9ed80 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FmaCase::FmaCase((FmaCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                             iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  vecSize_00 = 1;
  do {
    baseType = TYPE_INT;
    if (1 < vecSize_00) {
      baseType = glu::getDataTypeIntVec(vecSize_00);
    }
    baseType_00 = TYPE_UINT;
    if (1 < vecSize_00) {
      baseType_00 = glu::getDataTypeUintVec(vecSize_00);
    }
    SVar7 = SHADERTYPE_VERTEX;
    do {
      iVar1 = 0x3c;
      if ((0x3cU >> (SVar7 & 0x1f) & 1) != 0) {
        pTVar5 = (TestNode *)operator_new(0x280);
        BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType,SVar7);
        tcu::TestNode::addChild(pTVar2,pTVar5);
        pTVar5 = (TestNode *)operator_new(0x280);
        BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType_00,SVar7
                  );
        tcu::TestNode::addChild(pTVar3,pTVar5);
        iVar1 = extraout_EAX;
      }
      SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
    } while (SVar7 != SHADERTYPE_LAST);
    vecSize_00 = vecSize_00 + 1;
  } while (vecSize_00 != 4);
  return iVar1;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS,
		NEW_SHADERS = TC|TE|GS|CS,
	};

	//																	Float?	Int?	Uint?	Shaders
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false,	NEW_SHADERS);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false,	NEW_SHADERS);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false,	NEW_SHADERS);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false,	NEW_SHADERS);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false,	NEW_SHADERS);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false,	NEW_SHADERS);

	addFunctionCases<FrexpCase>				(this,	"frexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<LdexpCase>				(this,	"ldexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FmaCase>				(this,	"fma",				true,	false,	false,	ALL_SHADERS);

	// (u)intBitsToFloat()
	{
		const deUint32		shaderBits	= NEW_SHADERS;
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (shaderBits & (1<<shaderType))
				{
					intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
					uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
				}
			}
		}
	}
}